

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::Generator::
GetResolvedFeatures<google::protobuf::EnumValueDescriptor>
          (string *__return_storage_ptr__,Generator *this,EnumValueDescriptor *descriptor)

{
  FileDescriptor *pFVar1;
  pointer ppFVar2;
  bool bVar3;
  FieldOptions_OptionRetention FVar4;
  Descriptor *pDVar5;
  DescriptorStringView psVar6;
  pointer pDVar7;
  Message *pMVar8;
  pointer pMVar9;
  type pMVar10;
  reference ppFVar11;
  long lVar12;
  LogMessage *pLVar13;
  FieldOptions *this_00;
  EnumValueDescriptor *pEVar14;
  char *in_R8;
  undefined1 auVar15 [16];
  string_view separator;
  AlphaNum local_318;
  basic_string_view<char,_std::char_traits<char>_> local_2e8;
  string local_2d8;
  AlphaNum local_2b8;
  AlphaNum local_288;
  string local_258;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)524292>
  local_238;
  string local_228;
  AlphaNum local_208;
  AlphaNum local_1d8;
  AlphaNum local_1a8;
  undefined1 local_178 [40];
  EnumValueDescriptor *value;
  EnumDescriptor *enm;
  basic_string_view<char,_std::char_traits<char>_> local_140;
  LogMessageFatal local_130 [23];
  Voidify local_119;
  FieldDescriptor *local_118;
  FieldDescriptor *field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  feature_args;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> local_90;
  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_> features;
  __single_object message_factory;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  LogMessageFatal local_68 [23];
  Voidify local_51;
  undefined1 local_50 [16];
  long local_40;
  Descriptor *feature_set;
  allocator<char> local_21;
  EnumValueDescriptor *local_20;
  EnumValueDescriptor *descriptor_local;
  Generator *this_local;
  
  local_20 = descriptor;
  descriptor_local = (EnumValueDescriptor *)this;
  this_local = (Generator *)__return_storage_ptr__;
  bVar3 = GeneratingDescriptorProto(this);
  if (bVar3) {
    pFVar1 = this->file_;
    pDVar5 = FeatureSet::GetDescriptor();
    psVar6 = Descriptor::name_abi_cxx11_(pDVar5);
    local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    local_40 = google::protobuf::FileDescriptor::FindMessageTypeByName
                         (pFVar1,local_50._0_8_,local_50._8_8_);
    if (local_40 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_78,"feature_set != nullptr");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
                 ,0x1d7,local_78._M_len);
      pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_68)
      ;
      pLVar13 = absl::lts_20240722::log_internal::LogMessage::operator<<
                          (pLVar13,(char (*) [44])"Malformed descriptor.proto doesn\'t contain ");
      pDVar5 = FeatureSet::GetDescriptor();
      psVar6 = Descriptor::full_name_abi_cxx11_(pDVar5);
      pLVar13 = (LogMessage *)
                absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar13,(string *)psVar6);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_51,pLVar13);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_68);
    }
    std::make_unique<google::protobuf::DynamicMessageFactory>();
    pDVar7 = std::
             unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
             ::operator->((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                           *)&features);
    pMVar8 = (Message *)(**(code **)(*(long *)pDVar7 + 0x10))(pDVar7,local_40);
    pMVar8 = Message::New(pMVar8);
    absl::lts_20240722::WrapUnique<google::protobuf::Message>((lts_20240722 *)&local_90,pMVar8);
    pMVar9 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::operator->(&local_90);
    CodeGenerator::GetResolvedSourceFeatures<google::protobuf::EnumValueDescriptor>(local_20);
    google::protobuf::MessageLite::SerializeAsString_abi_cxx11_();
    auVar15 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)
                         &feature_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    google::protobuf::MessageLite::ParseFromString(pMVar9,auVar15._0_8_,auVar15._8_8_);
    std::__cxx11::string::~string
              ((string *)
               &feature_args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&reflection);
    pMVar9 = std::
             unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
             ::operator->(&local_90);
    fields.
    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Message::GetReflection(pMVar9);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&__range3);
    ppFVar2 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pMVar10 = std::
              unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
              ::operator*(&local_90);
    google::protobuf::Reflection::ListFields((Message *)ppFVar2,(vector *)pMVar10);
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      *)&__range3);
    field = (FieldDescriptor *)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)&__range3);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                  *)&field);
      if (!bVar3) break;
      ppFVar11 = __gnu_cxx::
                 __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                 ::operator*(&__end3);
      local_118 = *ppFVar11;
      enm._7_1_ = 0;
      lVar12 = google::protobuf::FieldDescriptor::enum_type();
      if (lVar12 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_140,"field->enum_type() != nullptr");
        in_R8 = local_140._M_str;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
                   ,0x1e9,local_140._M_len);
        enm._7_1_ = 1;
        pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)local_130);
        pLVar13 = absl::lts_20240722::log_internal::LogMessage::operator<<
                            (pLVar13,(char (*) [33])"Unexpected non-enum field found!");
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_119,pLVar13);
      }
      if ((enm._7_1_ & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_130);
      }
      this_00 = FieldDescriptor::options(local_118);
      FVar4 = FieldOptions::retention(this_00);
      if (FVar4 != FieldOptions_OptionRetention_RETENTION_SOURCE) {
        pEVar14 = (EnumValueDescriptor *)google::protobuf::FieldDescriptor::enum_type();
        ppFVar2 = fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        value = pEVar14;
        pMVar10 = std::
                  unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>
                  ::operator*(&local_90);
        google::protobuf::Reflection::GetEnumValue((Message *)ppFVar2,(FieldDescriptor *)pMVar10);
        local_178._32_8_ = google::protobuf::EnumDescriptor::FindValueByNumber((int)pEVar14);
        psVar6 = FieldDescriptor::name_abi_cxx11_(local_118);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1a8,psVar6);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_1d8,"=");
        absl::lts_20240722::str_format_internal::
        FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)524292,_(absl::lts_20240722::FormatConversionCharSet)524292>
        ::FormatSpecTemplate(&local_238,"%s.values_by_name[\"%s\"].number");
        ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                  (&local_258,this,(EnumDescriptor *)value);
        psVar6 = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)local_178._32_8_);
        absl::lts_20240722::
        StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  (&local_228,&local_238,&local_258,psVar6);
        absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_208,&local_228);
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_178,&local_1a8,&local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&reflection,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178);
        std::__cxx11::string::~string((string *)local_178);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_258);
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    absl::lts_20240722::AlphaNum::AlphaNum(&local_288,"_ResolvedFeatures(");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2e8,",");
    separator._M_str = in_R8;
    separator._M_len = (size_t)local_2e8._M_str;
    absl::lts_20240722::
    StrJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_2d8,(lts_20240722 *)&reflection,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2e8._M_len,separator);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_2b8,&local_2d8);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_318,")");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_288,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&__range3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reflection);
    std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>::
    ~unique_ptr(&local_90);
    std::
    unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
    ::~unique_ptr((unique_ptr<google::protobuf::DynamicMessageFactory,_std::default_delete<google::protobuf::DynamicMessageFactory>_>
                   *)&features);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"None",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::GetResolvedFeatures(
    const DescriptorT& descriptor) const {
  if (!GeneratingDescriptorProto()) {
    // Everything but descriptor.proto can handle proper feature resolution.
    return "None";
  }

  // Load the resolved features from our pool.
  const Descriptor* feature_set =
      file_->FindMessageTypeByName(FeatureSet::GetDescriptor()->name());
  ABSL_CHECK(feature_set != nullptr)
      << "Malformed descriptor.proto doesn't contain "
      << FeatureSet::GetDescriptor()->full_name();
  auto message_factory = absl::make_unique<DynamicMessageFactory>();
  auto features =
      absl::WrapUnique(message_factory->GetPrototype(feature_set)->New());
  features->ParseFromString(
      GetResolvedSourceFeatures(descriptor).SerializeAsString());

  // Collect all of the resolved features.
  std::vector<std::string> feature_args;
  const Reflection* reflection = features->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*features, &fields);
  for (const auto* field : fields) {
    // Assume these are all enums.  If we add non-enum global features or any
    // python-specific features, we will need to come back and improve this
    // logic.
    ABSL_CHECK(field->enum_type() != nullptr)
        << "Unexpected non-enum field found!";
    if (field->options().retention() == FieldOptions::RETENTION_SOURCE) {
      // Skip any source-retention features.
      continue;
    }
    const EnumDescriptor* enm = field->enum_type();
    const EnumValueDescriptor* value =
        enm->FindValueByNumber(reflection->GetEnumValue(*features, field));

    feature_args.emplace_back(absl::StrCat(
        field->name(), "=",
        absl::StrFormat("%s.values_by_name[\"%s\"].number",
                        ModuleLevelDescriptorName(*enm), value->name())));
  }
  return absl::StrCat("_ResolvedFeatures(", absl::StrJoin(feature_args, ","),
                      ")");
}